

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_eigen.hpp
# Opt level: O0

Tensor<2> * Omega_h::exp_spd_old<2>(Tensor<2> m)

{
  int iVar1;
  Vector<2> *pVVar2;
  Tensor<2> *in_RDI;
  Tensor<2> *pTVar3;
  double extraout_XMM0_Qa;
  double __x;
  double extraout_XMM0_Qa_00;
  double dVar4;
  double local_1518;
  double local_14c0;
  double local_14b8;
  int local_1464;
  Int i_14;
  double local_1448 [2];
  DiagDecomp<2> decomp;
  DiagDecomp<2> decomp_1;
  double local_1350;
  Matrix<2,_2> c;
  Real nm;
  Int i_13;
  double local_12f8 [3];
  Vector<2> c_4;
  double local_1278;
  Matrix<2,_2> b_3;
  double local_1248;
  Tensor<2> a_4;
  double local_1218 [3];
  Matrix<2,_2> c_5;
  double local_11b8 [12];
  int local_1158;
  Int j_9;
  double local_1118 [12];
  int local_10b8;
  Int j_6;
  double local_1098 [4];
  int local_1074;
  int local_1070;
  Int j_8;
  Int i_20;
  undefined1 local_1030 [8];
  double local_1028;
  double local_1020;
  double local_1018;
  int local_1010;
  int local_100c;
  Int i;
  Int j;
  Real x;
  double local_ff8;
  int local_fec;
  undefined1 *local_fe8;
  int local_fdc;
  undefined1 *local_fd8;
  undefined8 local_fd0;
  double local_fc8;
  double local_fc0 [4];
  double local_fa0;
  double local_f98;
  int local_f7c;
  double dStack_f78;
  Int j_2;
  int local_f6c;
  double *local_f68;
  int local_f5c;
  double *local_f58;
  double local_f50;
  double local_f48;
  double local_f40;
  double local_f38;
  double local_f30;
  Matrix<2,_2> a_3;
  undefined8 uStack_ee0;
  double dStack_ed8;
  Int i_5;
  Vector<2> l;
  Tensor<2> q;
  Few<double,_2> roots;
  Int nroots;
  int local_e70;
  Roots<2> roots_obj;
  int local_dcc;
  int local_dc8;
  Int i_12;
  Int j_4;
  int local_d9c;
  int local_d98;
  Int i_1;
  Int j_1;
  int local_d6c;
  Int i_2;
  undefined8 local_d60;
  Vector<2> v;
  int local_d3c;
  Int i_3;
  double local_d30 [3];
  Vector<2> c_1;
  Few<double,_2> poly;
  double local_ba8;
  Few<double,_2> coeffs;
  Real disc;
  Few<int,_2> mults;
  Few<double,_2> roots_1;
  double b_1;
  double a_2;
  undefined1 local_b40 [60];
  undefined4 local_b04;
  Few<int,_2> *local_b00;
  undefined4 local_af4;
  Few<int,_2> *local_af0;
  undefined4 local_ae4;
  Few<int,_2> *local_ae0;
  undefined4 local_ad4;
  Few<int,_2> *local_ad0;
  undefined4 local_ac4;
  Few<int,_2> *local_ac0;
  undefined4 local_ab4;
  Few<int,_2> *local_ab0;
  undefined4 local_aa4;
  Few<int,_2> *local_aa0;
  undefined4 local_a94;
  undefined1 *local_a90;
  undefined4 local_a84;
  undefined1 *local_a80;
  undefined4 local_a74;
  Real *local_a70;
  undefined4 local_a64;
  Real *local_a60;
  undefined4 local_a54;
  Real *local_a50;
  undefined4 local_a44;
  Real *local_a40;
  undefined4 local_a34;
  Real *local_a30;
  undefined4 local_a24;
  Real *local_a20;
  undefined4 local_a14;
  Real *local_a10;
  double local_a08 [4];
  int local_9e4;
  double dStack_9e0;
  Int i_4;
  Real t;
  double *local_9d0;
  undefined4 local_9c4;
  double *local_9c0;
  int local_9b4;
  double *local_9b0;
  undefined4 local_9a4;
  double *local_9a0;
  double local_998;
  double dStack_990;
  double local_988;
  double dStack_980;
  Real d;
  Real c_2;
  Real b;
  Real a_1;
  double *local_948;
  undefined4 local_93c;
  double *local_938;
  undefined4 local_92c;
  double *local_928;
  undefined4 local_91c;
  double *local_918;
  undefined4 local_90c;
  double *local_908;
  undefined4 local_8fc;
  double *local_8f8;
  undefined4 local_8ec;
  double *local_8e8;
  undefined4 local_8dc;
  double *local_8d8;
  undefined1 local_8d0 [36];
  undefined4 local_8ac;
  undefined1 *local_8a8;
  undefined4 local_89c;
  undefined1 *local_898;
  double local_890;
  double local_888;
  double local_880;
  double local_878;
  double local_870;
  double local_868;
  double local_860;
  double local_858;
  double local_850;
  Real row_norm;
  Int i_9;
  double local_830;
  Real best_norm;
  double dStack_820;
  int best_row;
  double local_818;
  double local_810 [3];
  Matrix<2,_2> ta;
  double local_7a0 [4];
  int local_77c;
  int local_778;
  Int j_3;
  Int i_7;
  int local_764;
  double *local_760;
  int local_754;
  double *local_750;
  int local_744;
  double *local_740;
  int local_734;
  double dStack_730;
  Int i_11;
  double local_728 [3];
  Vector<2> c_3;
  double local_6e8 [4];
  int local_6c4;
  double dStack_6c0;
  Int i_6;
  int local_6b4;
  double *local_6b0;
  int local_6a4;
  double *local_6a0;
  double local_690;
  double local_688;
  Vector<2> v_1;
  int local_534;
  double dStack_530;
  Int i_8;
  double out;
  double local_518 [2];
  int local_504;
  double *local_500;
  int local_4f4;
  double *local_4f0;
  undefined4 local_4e4;
  double *local_4e0;
  undefined4 local_4d4;
  double *local_4d0;
  int local_4c4;
  double dStack_4c0;
  Int i_10;
  double out_1;
  double local_4b0;
  double local_4a8 [2];
  int local_494;
  double *local_490;
  int local_484;
  double *local_480;
  undefined4 local_474;
  double *local_470;
  undefined4 local_464;
  double *local_460;
  int local_454;
  int local_450;
  Int i_16;
  Int j_5;
  Int i_15;
  int local_364;
  Int j_7;
  double local_350 [3];
  Vector<2> c_6;
  int local_2ec;
  Int i_18;
  double local_2e0 [3];
  Vector<2> c_8;
  int local_29c;
  Int i_17;
  double local_290 [3];
  Vector<2> c_7;
  int local_24c;
  Int i_19;
  double local_238 [3];
  Vector<2> c_9;
  int local_184;
  Int j_10;
  double local_170 [3];
  Vector<2> c_10;
  int local_10c;
  Int i_22;
  double local_100 [3];
  Vector<2> c_12;
  int local_bc;
  Int i_21;
  double local_b0 [3];
  Vector<2> c_11;
  int local_6c;
  Int i_23;
  double local_58 [3];
  Vector<2> c_13;
  
  local_1028 = m.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_[0];
  local_1020 = m.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_[1];
  local_1018 = m.super_Few<Omega_h::Vector<2>,_2>.array_[1].super_Few<double,_2>.array_[0];
  _i = 0.0;
  pTVar3 = in_RDI;
  for (local_100c = 0; dVar4 = _i, local_100c < 2; local_100c = local_100c + 1) {
    for (local_1010 = 0; dVar4 = _i, local_1010 < 2; local_1010 = local_1010 + 1) {
      local_fd8 = local_1030;
      local_fdc = local_100c;
      local_fe8 = local_fd8 + (long)local_100c * 0x10;
      local_fec = local_1010;
      std::abs((int)pTVar3);
      local_ff8 = dVar4;
      local_14b8 = extraout_XMM0_Qa;
      if (extraout_XMM0_Qa <= dVar4) {
        local_14b8 = dVar4;
      }
      _i = local_14b8;
    }
  }
  if (1e-10 < _i) {
    local_fc0[1] = m.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_[0];
    local_fc0[2] = m.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_[1];
    local_fc0[3] = m.super_Few<Omega_h::Vector<2>,_2>.array_[1].super_Few<double,_2>.array_[0];
    dStack_f78 = _i;
    for (local_f7c = 0; local_f7c < 2; local_f7c = local_f7c + 1) {
      local_f5c = local_f7c;
      local_f58 = local_fc0;
      local_fa0 = local_f58[(long)local_f7c * 2];
      local_f98 = local_fc0[(long)local_f7c * 2 + 1];
      for (local_d3c = 0; local_d3c < 2; local_d3c = local_d3c + 1) {
        c_1.super_Few<double,_2>.array_[1]._4_4_ = local_d3c;
        (&c_1)[-1].super_Few<double,_2>.array_[(long)local_d3c + 1] = local_d30[local_d3c] / _i;
      }
      local_f6c = local_f7c;
      local_f68 = &local_1350;
      local_f68[(long)local_f7c * 2] = local_d30[2];
      c.super_Few<Omega_h::Vector<2>,_2>.array_[local_f7c].super_Few<double,_2>.array_[0] =
           c_1.super_Few<double,_2>.array_[0];
      local_d30[0] = local_fa0;
      local_d30[1] = local_f98;
    }
    local_f50 = local_1350;
    local_f48 = c.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_[0];
    local_f40 = c.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_[1];
    local_f38 = c.super_Few<Omega_h::Vector<2>,_2>.array_[1].super_Few<double,_2>.array_[0];
    local_a08[0] = local_1350;
    local_a08[1] = c.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_[0];
    local_a08[2] = c.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_[1];
    local_a08[3] = c.super_Few<Omega_h::Vector<2>,_2>.array_[1].super_Few<double,_2>.array_[0];
    local_9c0 = local_a08;
    local_9a4 = 0;
    local_9c4 = 0;
    dStack_9e0 = local_1350;
    for (local_9e4 = 1; local_9e4 < 2; local_9e4 = local_9e4 + 1) {
      local_9b4 = local_9e4;
      local_9b0 = local_a08;
      local_9d0 = local_9b0 + (long)local_9e4 * 2;
      t._4_4_ = local_9e4;
      dStack_9e0 = local_9d0[local_9e4] + dStack_9e0;
    }
    local_988 = c.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_[1];
    dStack_980 = c.super_Few<Omega_h::Vector<2>,_2>.array_[1].super_Few<double,_2>.array_[0];
    local_998 = local_1350;
    dStack_990 = c.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_[0];
    local_938 = &local_998;
    local_8dc = 0;
    local_91c = 0;
    local_8ec = 1;
    local_928 = &local_988;
    local_92c = 0;
    local_8fc = 0;
    local_93c = 1;
    local_90c = 1;
    local_948 = &local_988;
    a_1._4_4_ = 1;
    local_a80 = local_b40;
    local_a84 = 1;
    local_a90 = local_b40;
    local_a94 = 0;
    local_aa0 = &mults;
    local_aa4 = 1;
    local_ab0 = &mults;
    local_ab4 = 0;
    local_a10 = &disc;
    local_a14 = 1;
    local_a20 = &disc;
    local_a24 = 0;
    __x = local_ba8 * -4.0 + coeffs.array_[0] * coeffs.array_[0];
    local_9a0 = local_9c0;
    local_918 = local_938;
    local_908 = local_938;
    local_8f8 = local_938;
    local_8e8 = local_938;
    local_8d8 = local_938;
    std::abs((int)pTVar3);
    roots_obj.values.array_[1]._0_4_ = disc._0_4_;
    if (5e-05 <= extraout_XMM0_Qa_00) {
      if (__x <= 0.0) {
        local_e70 = 0;
      }
      else {
        local_a60 = &disc;
        local_a64 = 0;
        local_a70 = &disc;
        local_a74 = 1;
        sqrt(__x);
        local_af0 = &mults;
        local_af4 = 0;
        sqrt(__x);
        local_b00 = &mults;
        local_b04 = 1;
        local_e70 = 2;
        roots_obj.values.array_[1]._0_4_ = disc._0_4_;
      }
    }
    else {
      local_a30 = &disc;
      local_a34 = 0;
      local_ac0 = &mults;
      local_ac4 = 0;
      local_ad0 = &mults;
      local_ad4 = 0;
      local_ae0 = &mults;
      local_ae4 = 1;
      local_a40 = &disc;
      local_a44 = 0;
      local_a50 = &disc;
      local_a54 = 1;
      local_e70 = 1;
    }
    q.super_Few<Omega_h::Vector<2>,_2>.array_[1].super_Few<double,_2>.array_[1] =
         (double)mults.array_;
    if (local_e70 == 2) {
      for (uStack_ee0._4_4_ = 0; uStack_ee0._4_4_ < 2; uStack_ee0._4_4_ = uStack_ee0._4_4_ + 1) {
        a_3.super_Few<Omega_h::Vector<2>,_2>.array_[1].super_Few<double,_2>.array_[1] = local_f50;
        dStack_6c0 = (&roots)[-1].array_[(long)uStack_ee0._4_4_ + 1];
        local_6e8[0] = local_f50;
        local_6e8[1] = local_f48;
        local_6e8[2] = local_f40;
        local_6e8[3] = local_f38;
        for (local_6c4 = 0; local_6c4 < 2; local_6c4 = local_6c4 + 1) {
          local_6a4 = local_6c4;
          local_6a0 = local_6e8;
          local_6b0 = local_6a0 + (long)local_6c4 * 2;
          local_6b4 = local_6c4;
          local_6b0[local_6c4] = local_6b0[local_6c4] - dStack_6c0;
        }
        local_890 = local_f50;
        local_888 = local_f48;
        local_880 = local_f40;
        local_878 = local_f38;
        dStack_820 = local_f50;
        local_818 = local_f48;
        local_810[0] = local_f40;
        local_810[1] = local_f38;
        local_7a0[0] = local_f50;
        local_7a0[1] = local_f48;
        local_7a0[2] = local_f40;
        local_7a0[3] = local_f38;
        for (local_778 = 0; local_778 < 2; local_778 = local_778 + 1) {
          for (local_77c = 0; local_77c < 2; local_77c = local_77c + 1) {
            local_744 = local_77c;
            local_740 = local_7a0;
            local_760 = local_740 + (long)local_77c * 2;
            local_764 = local_778;
            local_754 = local_778;
            local_750 = local_810 + 2;
            _i_7 = local_750 + (long)local_778 * 2;
            j_3 = local_77c;
            _i_7[local_77c] = local_760[local_778];
          }
        }
        best_norm._4_4_ = 0;
        local_4d0 = local_518;
        local_4d4 = 0;
        local_4e0 = &out;
        local_4e4 = 0;
        dStack_530 = local_810[2] * local_810[2];
        for (local_534 = 1; local_534 < 2; local_534 = local_534 + 1) {
          local_4f4 = local_534;
          local_4f0 = local_518;
          local_504 = local_534;
          local_500 = &out;
          dStack_530 = local_4f0[local_534] * local_500[local_534] + dStack_530;
        }
        local_830 = sqrt(dStack_530);
        for (row_norm._4_4_ = 1; row_norm._4_4_ < 2; row_norm._4_4_ = row_norm._4_4_ + 1) {
          local_860 = (&ta)[-1].super_Few<Omega_h::Vector<2>,_2>.array_[(long)row_norm._4_4_ + 1].
                      super_Few<double,_2>.array_[1];
          local_858 = ta.super_Few<Omega_h::Vector<2>,_2>.array_[row_norm._4_4_].
                      super_Few<double,_2>.array_[0];
          local_460 = local_4a8;
          local_464 = 0;
          local_470 = &out_1;
          local_474 = 0;
          dStack_4c0 = local_860 * local_860;
          for (local_4c4 = 1; local_4c4 < 2; local_4c4 = local_4c4 + 1) {
            local_484 = local_4c4;
            local_480 = local_4a8;
            local_494 = local_4c4;
            local_490 = &out_1;
            dStack_4c0 = local_480[local_4c4] * local_490[local_4c4] + dStack_4c0;
          }
          out_1 = local_860;
          local_4b0 = local_858;
          local_4a8[0] = local_860;
          local_4a8[1] = local_858;
          local_850 = sqrt(dStack_4c0);
          if (local_830 < local_850) {
            best_norm._4_4_ = row_norm._4_4_;
            local_830 = local_850;
          }
        }
        if (local_830 <= 1e-10) {
          fail("assertion %s failed at %s +%d\n","best_norm > EPSILON",
               "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_eigen.hpp"
               ,0xd3);
        }
        local_870 = (&ta)[-1].super_Few<Omega_h::Vector<2>,_2>.array_[(long)best_norm._4_4_ + 1].
                    super_Few<double,_2>.array_[1];
        local_868 = ta.super_Few<Omega_h::Vector<2>,_2>.array_[best_norm._4_4_].super_Few<double,_2>
                    .array_[0];
        dStack_730 = local_830;
        for (local_734 = 0; local_734 < 2; local_734 = local_734 + 1) {
          c_3.super_Few<double,_2>.array_[1]._4_4_ = local_734;
          (&c_3)[-1].super_Few<double,_2>.array_[(long)local_734 + 1] =
               local_728[local_734] / local_830;
        }
        local_89c = 1;
        local_8ac = 0;
        v_1.super_Few<double,_2>.array_[1]._4_4_ = 1;
        (&q)[-1].super_Few<Omega_h::Vector<2>,_2>.array_[(long)uStack_ee0._4_4_ + 1].
        super_Few<double,_2>.array_[1] = local_688;
        q.super_Few<Omega_h::Vector<2>,_2>.array_[uStack_ee0._4_4_].super_Few<double,_2>.array_[0] =
             v_1.super_Few<double,_2>.array_[0];
        (&q)[-1].super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_
        [(long)uStack_ee0._4_4_ + 1] = (&roots)[-1].array_[(long)uStack_ee0._4_4_ + 1];
        local_8a8 = local_8d0;
        local_898 = local_8d0;
        local_728[0] = local_870;
        local_728[1] = local_868;
        local_690 = -c_3.super_Few<double,_2>.array_[0];
      }
    }
    else {
      if ((local_e70 != 1) || (roots_obj.values.array_[1]._0_4_ != 2)) {
        fail("assertion %s failed at %s +%d\n","nroots == 1 && roots_obj.mults[0] == 2",
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_eigen.hpp"
             ,0x119);
      }
      for (local_dc8 = 0; local_dc8 < 2; local_dc8 = local_dc8 + 1) {
        for (local_dcc = 0; local_dcc < 2; local_dcc = local_dcc + 1) {
          local_1518 = 1.0;
          if (local_dcc != local_dc8) {
            local_1518 = 0.0;
          }
          a_3.super_Few<Omega_h::Vector<2>,_2>.array_[(long)local_dc8 + -1].super_Few<double,_2>.
          array_[(long)local_dcc + 1] = local_1518;
        }
      }
      l.super_Few<double,_2>.array_[1] = local_f30;
      q.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_[0] =
           a_3.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_[0];
      q.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_[1] =
           a_3.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_[1];
      q.super_Few<Omega_h::Vector<2>,_2>.array_[1].super_Few<double,_2>.array_[0] =
           a_3.super_Few<Omega_h::Vector<2>,_2>.array_[1].super_Few<double,_2>.array_[0];
    }
    local_1448[1] = l.super_Few<double,_2>.array_[1];
    decomp.q.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_[0] =
         q.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_[0];
    decomp.q.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_[1] =
         q.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_[1];
    decomp.q.super_Few<Omega_h::Vector<2>,_2>.array_[1].super_Few<double,_2>.array_[0] =
         q.super_Few<Omega_h::Vector<2>,_2>.array_[1].super_Few<double,_2>.array_[0];
    local_12f8[0] = dStack_ed8;
    local_12f8[1] = l.super_Few<double,_2>.array_[0];
    for (nm._4_4_ = 0; nm._4_4_ < 2; nm._4_4_ = nm._4_4_ + 1) {
      c_4.super_Few<double,_2>.array_[1]._4_4_ = nm._4_4_;
      (&c_4)[-1].super_Few<double,_2>.array_[(long)nm._4_4_ + 1] = local_12f8[nm._4_4_] * dVar4;
    }
  }
  else {
    for (local_d98 = 0; local_d98 < 2; local_d98 = local_d98 + 1) {
      for (local_d9c = 0; local_d9c < 2; local_d9c = local_d9c + 1) {
        local_14c0 = 1.0;
        if (local_d9c != local_d98) {
          local_14c0 = 0.0;
        }
        (&(&decomp)[-1].l)[local_d98].super_Few<double,_2>.array_[(long)local_d9c + 1] = local_14c0;
      }
    }
    for (local_d6c = 0; local_d6c < 2; local_d6c = local_d6c + 1) {
      v.super_Few<double,_2>.array_[1]._4_4_ = local_d6c;
      (&v)[-1].super_Few<double,_2>.array_[(long)local_d6c + 1] = 0.0;
    }
    local_fd0 = local_d60;
    local_fc8 = v.super_Few<double,_2>.array_[0];
  }
  for (local_1464 = 0; local_1464 < 2; local_1464 = local_1464 + 1) {
    dVar4 = exp((&decomp.l)[-1].super_Few<double,_2>.array_[(long)local_1464 + 1]);
    iVar1 = local_1464;
    (&decomp.l)[-1].super_Few<double,_2>.array_[(long)local_1464 + 1] = dVar4;
    decomp.l.super_Few<double,_2>.array_[1]._4_4_ = iVar1;
  }
  for (i_16 = 0; local_450 = i_16, i_16 < 2; i_16 = i_16 + 1) {
    while (local_450 = local_450 + 1, local_450 < 2) {
      (&a_4)[-1].super_Few<Omega_h::Vector<2>,_2>.array_[(long)local_450 + 1].super_Few<double,_2>.
      array_[(long)i_16 + 1] = 0.0;
      (&a_4)[-1].super_Few<Omega_h::Vector<2>,_2>.array_[(long)i_16 + 1].super_Few<double,_2>.array_
      [(long)local_450 + 1] = 0.0;
    }
  }
  for (local_454 = 0; local_454 < 2; local_454 = local_454 + 1) {
    (&a_4)[-1].super_Few<Omega_h::Vector<2>,_2>.array_[(long)local_454 + 1].super_Few<double,_2>.
    array_[(long)local_454 + 1] = *(double *)(&j_5 + (long)local_454 * 2);
  }
  for (local_10b8 = 0; local_10b8 < 2; local_10b8 = local_10b8 + 1) {
    dVar4 = local_1118[(long)local_10b8 * 2];
    for (local_29c = 0; local_29c < 2; local_29c = local_29c + 1) {
      (&c_7)[-1].super_Few<double,_2>.array_[(long)local_29c + 1] = local_290[local_29c] * dVar4;
    }
    local_350[2] = local_290[2];
    c_6.super_Few<double,_2>.array_[0] = c_7.super_Few<double,_2>.array_[0];
    for (local_364 = 1; local_364 < 2; local_364 = local_364 + 1) {
      dVar4 = local_350[local_364];
      for (local_2ec = 0; local_2ec < 2; local_2ec = local_2ec + 1) {
        (&c_8)[-1].super_Few<double,_2>.array_[(long)local_2ec + 1] = local_2e0[local_2ec] * dVar4;
      }
      for (local_24c = 0; local_24c < 2; local_24c = local_24c + 1) {
        (&c_9)[-1].super_Few<double,_2>.array_[(long)local_24c + 1] =
             local_238[local_24c] + *(double *)(&stack0xfffffffffffffdb8 + (long)local_24c * 8);
      }
      local_350[2] = local_238[2];
      c_6.super_Few<double,_2>.array_[0] = c_9.super_Few<double,_2>.array_[0];
    }
    (&c_5)[-1].super_Few<Omega_h::Vector<2>,_2>.array_[(long)local_10b8 + 1].super_Few<double,_2>.
    array_[1] = local_350[2];
    c_5.super_Few<Omega_h::Vector<2>,_2>.array_[local_10b8].super_Few<double,_2>.array_[0] =
         c_6.super_Few<double,_2>.array_[0];
  }
  for (local_1070 = 0; local_1070 < 2; local_1070 = local_1070 + 1) {
    for (local_1074 = 0; local_1074 < 2; local_1074 = local_1074 + 1) {
      b_3.super_Few<Omega_h::Vector<2>,_2>.array_[(long)local_1070 + -1].super_Few<double,_2>.array_
      [(long)local_1074 + 1] = local_1098[(long)local_1074 * 2 + (long)local_1070];
    }
  }
  for (local_1158 = 0; local_1158 < 2; local_1158 = local_1158 + 1) {
    dVar4 = local_11b8[(long)local_1158 * 2];
    for (local_bc = 0; local_bc < 2; local_bc = local_bc + 1) {
      (&c_11)[-1].super_Few<double,_2>.array_[(long)local_bc + 1] = local_b0[local_bc] * dVar4;
    }
    local_170[2] = local_b0[2];
    c_10.super_Few<double,_2>.array_[0] = c_11.super_Few<double,_2>.array_[0];
    for (local_184 = 1; local_184 < 2; local_184 = local_184 + 1) {
      dVar4 = local_170[local_184];
      for (local_10c = 0; local_10c < 2; local_10c = local_10c + 1) {
        (&c_12)[-1].super_Few<double,_2>.array_[(long)local_10c + 1] = local_100[local_10c] * dVar4;
      }
      for (local_6c = 0; local_6c < 2; local_6c = local_6c + 1) {
        (&c_13)[-1].super_Few<double,_2>.array_[(long)local_6c + 1] =
             local_58[local_6c] + *(double *)(&stack0xffffffffffffff98 + (long)local_6c * 8);
      }
      local_170[2] = local_58[2];
      c_10.super_Few<double,_2>.array_[0] = c_13.super_Few<double,_2>.array_[0];
    }
    pVVar2 = (in_RDI->super_Few<Omega_h::Vector<2>,_2>).array_ + local_1158;
    (pVVar2->super_Few<double,_2>).array_[0] = local_170[2];
    (pVVar2->super_Few<double,_2>).array_[1] = c_10.super_Few<double,_2>.array_[0];
  }
  return in_RDI;
}

Assistant:

OMEGA_H_INLINE_BIG Tensor<dim> exp_spd_old(
    Tensor<dim> const m) OMEGA_H_NOEXCEPT {
  auto decomp = decompose_eigen(m);
  for (Int i = 0; i < dim; ++i) decomp.l[i] = std::exp(decomp.l[i]);
  return compose_ortho(decomp.q, decomp.l);
}